

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeMassMatrix(ChElementShellReissner4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double in_XMM0_Qa;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> inertia_n;
  ChMatrix33<double> Rot_I;
  ChMatrix33<double> box_inertia;
  ChMatrix33<double> Rot;
  assign_op<double,_double> local_191;
  plainobjectbase_evaluator_data<double,_3> local_190;
  DstXprType *local_188;
  ChElementShellReissner4 *local_180;
  ChMatrix33<double> *local_178;
  double local_170;
  ChMatrixNM<double,_24,_24> *local_168;
  double local_160;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_158 [2];
  ChMatrix33<double> local_110;
  undefined1 local_c8 [64];
  double local_88;
  DstXprType local_78;
  
  local_168 = &this->m_MassMatrix;
  uVar5 = 0;
  memset(local_168,0,0x1200);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x29])(this);
  local_170 = in_XMM0_Qa * this->tot_thickness;
  local_178 = this->T_i;
  pdVar7 = (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
           m_storage.m_data.array + 0x4b;
  local_180 = this;
  do {
    uVar4 = uVar5 & 0xffffffff ^ 2;
    local_160 = local_170 * local_180->alpha_i[uVar4];
    dVar1 = local_180->m_lenY * local_180->m_lenY;
    dVar2 = local_180->tot_thickness * local_180->tot_thickness;
    dVar3 = local_180->m_lenX * local_180->m_lenX;
    local_88 = local_160 * (dVar1 + dVar3) * 0.08333333333333333 * 0.25;
    local_c8 = ZEXT4064(CONCAT832(local_160 * (dVar2 + dVar3) * 0.08333333333333333 * 0.25,
                                  ZEXT832((ulong)(local_160 *
                                                 (dVar1 + dVar2) * 0.08333333333333333 * 0.25))));
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&((local_180->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->field_0x58;
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)(local_178 + uVar4);
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         1.48219693752374e-323;
    local_158[0].m_dst = (DstEvaluatorType *)&local_190;
    local_158[0].m_functor = &local_191;
    local_190.data = (double *)&local_78;
    local_158[0].m_src = (SrcEvaluatorType *)&local_110;
    local_158[0].m_dstExpr = &local_78;
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run(local_158);
    local_158[0].m_src = (SrcEvaluatorType *)local_c8;
    local_158[0].m_dst = (DstEvaluatorType *)&local_78;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_110,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)local_158);
    local_190.data = (double *)&local_110;
    local_188 = &local_78;
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)local_158,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)&local_190);
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar5 * 0x96] = local_160;
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar5 * 0x96 + 0x19] = local_160;
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar5 * 0x96 + 0x32] = local_160;
    uVar4 = (ulong)(-((uint)((int)local_168 + 0x18 + (int)uVar5 * 0x30) >> 3) & 7);
    if (2 < uVar4) {
      uVar4 = 3;
    }
    lVar6 = 0;
    do {
      if (uVar4 != 0) {
        memcpy(pdVar7 + lVar6,(void *)((long)&local_158[0].m_dst + lVar6),uVar4 * 8);
      }
      if (uVar4 < 3) {
        memcpy(pdVar7 + uVar4 + lVar6,(void *)((long)&local_158[0].m_dst + lVar6 + uVar4 * 8),
               uVar4 * -8 + 0x18);
      }
      else {
        uVar4 = 3;
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    uVar5 = uVar5 + 1;
    pdVar7 = pdVar7 + 0x96;
  } while (uVar5 != 4);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeMassMatrix() {
    m_MassMatrix.setZero();

    // loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
    double avg_density = this->GetDensity();
    double mass_per_area = avg_density * tot_thickness;

    // Heuristic, simplified 'lumped' mass matrix.
    // Split the mass in 4 pieces, weighting as the jacobian at integration point, but
    // lump at the node closest to integration point.
    // This is simpler than the stiffness-consistent mass matrix that would require
    // integration over gauss points.

    for (int n = 0; n < NUMNODES; n++) {
        int igp = (n + 2) % 4;  // id of closest gauss point to node
        double jacobian =
            alpha_i[igp];  // weight: jacobian at gauss point (another,brute force,option would be 0.25 for all nodes)

        double nodemass = (jacobian * mass_per_area);

        // Approximate (!) inertia of a quarter of tile, note *(1/4) because only the quarter tile,
        // in local system of Gauss point
        double Ixx = (pow(this->GetLengthY(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Iyy = (pow(this->GetLengthX(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Izz = (pow(this->GetLengthX(), 2) + pow(this->GetLengthY(), 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        ChMatrix33<> box_inertia(ChVector<>(Ixx, Iyy, Izz));
        // ..and rotate inertia in local system of node: (local because ystem-level rotational coords of nodes are
        // ang.vel in loc sys)
        // I' = A'* T * I * T' * A
        //    = Rot * I * Rot'
        ChMatrix33<> Rot = m_nodes[n]->GetA().transpose() * T_i[igp];
        ChMatrix33<> Rot_I(Rot * box_inertia);
        ChMatrix33<> inertia_n;
        inertia_n = Rot_I * Rot.transpose();

        int node_off = n * 6;
        m_MassMatrix(node_off + 0, node_off + 0) = nodemass;
        m_MassMatrix(node_off + 1, node_off + 1) = nodemass;
        m_MassMatrix(node_off + 2, node_off + 2) = nodemass;
        m_MassMatrix.block(node_off + 3, node_off + 3, 3, 3) = inertia_n;

    }  // end loop on nodes
}